

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O0

matd_t * matd_plu_l(matd_plu_t *mlu)

{
  uint uVar1;
  matd_t *pmVar2;
  matd_t *pmVar3;
  int local_28;
  uint local_24;
  int j;
  int i;
  matd_t *L;
  matd_t *lu;
  matd_plu_t *mlu_local;
  
  pmVar2 = mlu->lu;
  pmVar3 = matd_create(pmVar2->nrows,pmVar2->ncols);
  for (local_24 = 0; local_24 < pmVar2->nrows; local_24 = local_24 + 1) {
    uVar1 = pmVar3->ncols;
    pmVar3[(ulong)(local_24 * uVar1 + local_24) + 1].nrows = 0;
    pmVar3[(ulong)(local_24 * uVar1 + local_24) + 1].ncols = 0x3ff00000;
    for (local_28 = 0; local_28 < (int)local_24; local_28 = local_28 + 1) {
      pmVar3[(ulong)(local_24 * pmVar3->ncols + local_28) + 1] =
           pmVar2[(ulong)(local_24 * pmVar2->ncols + local_28) + 1];
    }
  }
  return pmVar3;
}

Assistant:

matd_t *matd_plu_l(const matd_plu_t *mlu)
{
    matd_t *lu = mlu->lu;

    matd_t *L = matd_create(lu->nrows, lu->ncols);
    for (int i = 0; i < lu->nrows; i++) {
        MATD_EL(L, i, i) = 1;

        for (int j = 0; j < i; j++) {
            MATD_EL(L, i, j) = MATD_EL(lu, i, j);
        }
    }

    return L;
}